

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_853dad::HandleTransformPathCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status,
               function<cmCMakePath_(const_cmCMakePath_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *transform,bool normalizeOption)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view value;
  string baseDirectory;
  cmAlphaNum local_220;
  function<cmCMakePath_(const_cmCMakePath_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *local_1f0;
  string inputPath;
  cmCMakePath path;
  _Any_data local_188;
  _Manager_type local_178;
  _Invoker_type p_Stack_170;
  bool local_168;
  Arguments arguments;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  ArgumentParserWithOutputVariable<Arguments> parser;
  
  local_1f0 = transform;
  memset(&arguments,0,0x88);
  path.Path._M_pathname._M_string_length = 0;
  path.Path._M_pathname._M_dataplus._M_p = (pointer)0x30;
  path.Path._M_pathname.field_2._8_8_ =
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_invoke;
  path.Path._M_pathname.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_manager;
  name._M_str = "OUTPUT_VARIABLE";
  name._M_len = 0xf;
  ArgumentParser::Base::Bind((Base *)&arguments,name,(KeywordAction *)&path);
  std::_Function_base::~_Function_base((_Function_base *)&path);
  path.Path._M_pathname._M_string_length = 0;
  path.Path._M_pathname._M_dataplus._M_p = (pointer)0x58;
  path.Path._M_pathname.field_2._8_8_ =
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_invoke;
  path.Path._M_pathname.field_2._M_allocated_capacity =
       (size_type)
       std::
       _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
       ::_M_manager;
  name_00._M_str = "BASE_DIRECTORY";
  name_00._M_len = 0xe;
  ArgumentParser::Base::Bind((Base *)&arguments,name_00,(KeywordAction *)&path);
  std::_Function_base::~_Function_base((_Function_base *)&path);
  ArgumentParser::ActionMap::ActionMap((ActionMap *)&parser,(ActionMap *)&arguments);
  this = &parser.super_CMakePathArgumentParser<Arguments>.Inputs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&arguments.BaseDirectory.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                           .
                           super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ._M_payload + 0x18));
  CMakePathArgumentParser<Arguments>::~CMakePathArgumentParser
            ((CMakePathArgumentParser<Arguments> *)&arguments);
  if (normalizeOption) {
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_color
         = _S_red;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0
    ;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl._0_8_ = 0x80;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)
         std::
         _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
         ::_M_invoke;
    arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
         = (_Base_ptr)
           std::
           _Function_handler<void_(ArgumentParser::Instance_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmArgumentParser.h:229:28)>
           ::_M_manager;
    name_01._M_str = "NORMALIZE";
    name_01._M_len = 9;
    ArgumentParser::Base::Bind((Base *)&parser,name_01,(KeywordAction *)&arguments);
    std::_Function_base::~_Function_base((_Function_base *)&arguments);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this);
  local_220.View_._M_str =
       (char *)(args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
  local_220.View_._M_len =
       (size_t)((args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 2);
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._0_8_
       & 0xffffffff00000000;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  arguments.Output.
  super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_engaged = false;
  arguments.BaseDirectory.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_engaged = false;
  arguments.Normalize = false;
  path.Path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  local_188._M_unused._M_object = (void *)0x0;
  local_188._8_8_ = 0;
  local_178 = (_Manager_type)0x0;
  p_Stack_170 = (_Invoker_type)0x0;
  local_168 = false;
  path.Path._M_pathname._M_dataplus._M_p = (pointer)&parser;
  path.Path._M_pathname._M_string_length = (size_type)&arguments;
  path.Path._M_pathname.field_2._M_allocated_capacity = (size_type)this;
  path.Path._M_pathname.field_2._8_8_ = &arguments;
  arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       arguments.super_ParseResult.KeywordErrors._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&path,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&local_220,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_188);
  bVar1 = ArgumentParser::ParseResult::MaybeReportError
                    (&arguments.super_ParseResult,status->Makefile);
  bVar2 = true;
  if (!bVar1) {
    if (parser.super_CMakePathArgumentParser<Arguments>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        parser.super_CMakePathArgumentParser<Arguments>.Inputs.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      baseDirectory._M_dataplus._M_p = (pointer)&baseDirectory.field_2;
      baseDirectory._M_string_length = 0;
      baseDirectory.field_2._M_local_buf[0] = '\0';
      if (arguments.BaseDirectory.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_engaged != true) {
        cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(status->Makefile);
      }
      std::__cxx11::string::_M_assign((string *)&baseDirectory);
      inputPath._M_dataplus._M_p = (pointer)&inputPath.field_2;
      inputPath._M_string_length = 0;
      inputPath.field_2._M_local_buf[0] = '\0';
      bVar2 = getInputPath((args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1,status,&inputPath);
      if (bVar2) {
        std::__cxx11::string::string((string *)&local_d8,(string *)&inputPath);
        cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                  ((cmCMakePath *)&local_220,&local_d8,generic_format);
        std::
        function<cmCMakePath_(const_cmCMakePath_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()(&path,local_1f0,(cmCMakePath *)&local_220,&baseDirectory);
        std::filesystem::__cxx11::path::~path((path *)&local_220);
        std::__cxx11::string::~string((string *)&local_d8);
        if (arguments.Normalize == true) {
          cmCMakePath::Normal((cmCMakePath *)&local_220,&path);
          cmCMakePath::operator=(&path,(cmCMakePath *)&local_220);
          std::filesystem::__cxx11::path::~path((path *)&local_220);
        }
        bVar1 = arguments.Output.
                super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
                .
                super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_engaged;
        this_00 = status->Makefile;
        pbVar3 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        std::filesystem::__cxx11::path::string((string *)&local_220,&path.Path);
        pbVar3 = pbVar3 + 1;
        if (bVar1 != false) {
          pbVar3 = (pointer)&arguments.Output;
        }
        value._M_str = (char *)local_220.View_._M_len;
        value._M_len = (size_t)local_220.View_._M_str;
        cmMakefile::AddDefinition(this_00,pbVar3,value);
        std::__cxx11::string::~string((string *)&local_220);
        std::filesystem::__cxx11::path::~path(&path.Path);
      }
      std::__cxx11::string::~string((string *)&inputPath);
      std::__cxx11::string::~string((string *)&baseDirectory);
    }
    else {
      pbVar3 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      path.Path._M_pathname._M_string_length = (size_type)(pbVar3->_M_dataplus)._M_p;
      path.Path._M_pathname._M_dataplus._M_p = (pointer)pbVar3->_M_string_length;
      local_220.View_._M_len = 0x22;
      local_220.View_._M_str = " called with unexpected arguments.";
      cmStrCat<>(&baseDirectory,(cmAlphaNum *)&path,&local_220);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      std::__cxx11::string::~string((string *)&baseDirectory);
      bVar2 = false;
    }
  }
  HandleTransformPathCommand::Arguments::~Arguments(&arguments);
  CMakePathArgumentParser<Arguments>::~CMakePathArgumentParser
            (&parser.super_CMakePathArgumentParser<Arguments>);
  return bVar2;
}

Assistant:

bool HandleTransformPathCommand(
  std::vector<std::string> const& args, cmExecutionStatus& status,
  const std::function<cmCMakePath(const cmCMakePath&,
                                  const std::string& base)>& transform,
  bool normalizeOption = false)
{
  struct Arguments : public ArgumentParser::ParseResult
  {
    cm::optional<ArgumentParser::NonEmpty<std::string>> Output;
    cm::optional<std::string> BaseDirectory;
    bool Normalize = false;
  };

  auto parser = ArgumentParserWithOutputVariable<Arguments>{}.Bind(
    "BASE_DIRECTORY"_s, &Arguments::BaseDirectory);
  if (normalizeOption) {
    parser.Bind("NORMALIZE"_s, &Arguments::Normalize);
  }

  Arguments arguments = parser.Parse(args);

  if (arguments.MaybeReportError(status.GetMakefile())) {
    return true;
  }

  if (!parser.GetInputs().empty()) {
    status.SetError(cmStrCat(args[0], " called with unexpected arguments."));
    return false;
  }

  std::string baseDirectory;
  if (arguments.BaseDirectory) {
    baseDirectory = *arguments.BaseDirectory;
  } else {
    baseDirectory = status.GetMakefile().GetCurrentSourceDirectory();
  }

  std::string inputPath;
  if (!getInputPath(args[1], status, inputPath)) {
    return false;
  }

  auto path = transform(cmCMakePath(inputPath), baseDirectory);
  if (arguments.Normalize) {
    path = path.Normal();
  }

  status.GetMakefile().AddDefinition(
    arguments.Output ? *arguments.Output : args[1], path.String());

  return true;
}